

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaBlockMetadata_Linear::CreateAllocationRequest_UpperAddress
          (VmaBlockMetadata_Linear *this,VkDeviceSize allocSize,VkDeviceSize allocAlignment,
          VmaSuballocationType allocType,uint32_t strategy,VmaAllocationRequest *pAllocationRequest)

{
  ulong uVar1;
  size_t sVar2;
  VmaSuballocation *pVVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  VmaSuballocationType VVar11;
  VmaSuballocationType VVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  
  uVar10 = (this->super_VmaBlockMetadata).m_Size;
  bVar14 = this->m_1stVectorIndex == 0;
  bVar4 = !bVar14;
  if (uVar10 < allocSize) {
    return false;
  }
  if (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    return false;
  }
  uVar1 = (this->super_VmaBlockMetadata).m_BufferImageGranularity;
  sVar2 = (&this->m_Suballocations0)[bVar14].m_Count;
  if ((sVar2 == 0) ||
     (uVar10 = (&this->m_Suballocations0)[bVar14].m_pArray[sVar2 - 1].offset, allocSize <= uVar10))
  {
    uVar10 = -allocAlignment & uVar10 - allocSize;
    if ((1 < uVar1) && ((uVar1 != allocAlignment && (sVar2 != 0)))) {
      lVar13 = sVar2 + 1;
      lVar6 = sVar2 * 0x20 + -8;
      bVar7 = false;
      bVar8 = false;
      do {
        lVar13 = lVar13 + -1;
        if (lVar13 == 0) break;
        pVVar3 = (&this->m_Suballocations0)[bVar14].m_pArray;
        if (((*(ulong *)((long)pVVar3 + lVar6 + -0x18) ^ (allocSize + uVar10) - 1) & -uVar1) == 0) {
          VVar11 = *(VmaSuballocationType *)((long)&pVVar3->offset + lVar6);
          VVar12 = allocType;
          if ((int)VVar11 < (int)allocType) {
            VVar12 = VVar11;
          }
          if ((int)VVar11 <= (int)allocType) {
            VVar11 = allocType;
          }
          switch(VVar12) {
          case VMA_SUBALLOCATION_TYPE_FREE:
          case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
            bVar15 = false;
            break;
          default:
            bVar15 = true;
            break;
          case VMA_SUBALLOCATION_TYPE_BUFFER:
            bVar15 = (VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN & 0xfffffffd) == 0;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
            bVar15 = VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3;
            break;
          case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
            bVar15 = VVar11 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
          }
          bVar8 = bVar7;
          if (bVar15) {
            bVar8 = true;
          }
          bVar15 = (bool)(bVar15 ^ 1);
          bVar7 = bVar8;
        }
        else {
          bVar15 = false;
        }
        lVar6 = lVar6 + -0x20;
      } while (bVar15);
      if (bVar8) {
        uVar10 = uVar10 & -uVar1;
      }
    }
    sVar2 = (&this->m_Suballocations0)[bVar4].m_Count;
    if (sVar2 == 0) {
      uVar9 = 0;
    }
    else {
      pVVar3 = (&this->m_Suballocations0)[bVar4].m_pArray;
      uVar9 = pVVar3[sVar2 - 1].size + pVVar3[sVar2 - 1].offset;
    }
    if (uVar9 <= uVar10) {
      if (1 < uVar1) {
        lVar13 = sVar2 + 1;
        lVar6 = sVar2 * 0x20 + -8;
        do {
          lVar13 = lVar13 + -1;
          if (lVar13 == 0) {
            bVar16 = 4;
            break;
          }
          pVVar3 = (&this->m_Suballocations0)[bVar4].m_pArray;
          if ((((*(long *)((long)pVVar3 + lVar6 + -0x10) + *(long *)((long)pVVar3 + lVar6 + -0x18))
                - 1U ^ uVar10) & -uVar1) == 0) {
            VVar11 = *(VmaSuballocationType *)((long)&pVVar3->offset + lVar6);
            VVar12 = VVar11;
            if ((int)allocType < (int)VVar11) {
              VVar12 = allocType;
            }
            if ((int)VVar11 < (int)allocType) {
              VVar11 = allocType;
            }
            switch(VVar12) {
            case VMA_SUBALLOCATION_TYPE_FREE:
            case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
              bVar16 = false;
              break;
            default:
              bVar16 = true;
              break;
            case VMA_SUBALLOCATION_TYPE_BUFFER:
              bVar16 = (VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN & 0xfffffffd) == 0;
              break;
            case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
              bVar16 = VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3;
              break;
            case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
              bVar16 = VVar11 == VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
            }
            bVar5 = bVar16 ^ 1;
          }
          else {
            bVar16 = 4;
            bVar5 = 0;
          }
          lVar6 = lVar6 + -0x20;
        } while (bVar5 != 0);
        if (bVar16 != 4) {
          return false;
        }
      }
      pAllocationRequest->allocHandle = (VmaAllocHandle)(uVar10 + 1);
      pAllocationRequest->type = UpperAddress;
      return true;
    }
  }
  return false;
}

Assistant:

VkDeviceSize GetSize() const { return m_Size; }